

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object.cpp
# Opt level: O0

uint __thiscall ON_Brep::ClearComponentStates(ON_Brep *this,ON_ComponentStatus states_to_clear)

{
  uchar uVar1;
  uchar uVar2;
  bool bVar3;
  uint uVar4;
  ON_BrepVertex *first;
  ON_BrepEdge *first_00;
  ON_BrepTrim *first_01;
  ON_BrepLoop *first_02;
  ON_BrepFace *first_03;
  ON_BrepFace *local_e0;
  ON_BrepFace *p_4;
  ON_ArrayIterator<const_ON_BrepFace> fit;
  ON_BrepLoop *local_b8;
  ON_BrepLoop *p_3;
  ON_ArrayIterator<const_ON_BrepLoop> lit;
  ON_BrepTrim *local_90;
  ON_BrepTrim *p_2;
  ON_ArrayIterator<const_ON_BrepTrim> tit;
  ON_BrepEdge *local_68;
  ON_BrepEdge *p_1;
  ON_ArrayIterator<const_ON_BrepEdge> eit;
  ON_BrepVertex *local_40;
  ON_BrepVertex *p;
  ON_ArrayIterator<const_ON_BrepVertex> vit;
  uint rc;
  ON_Brep *this_local;
  ON_ComponentStatus states_to_clear_local;
  
  this_local._2_2_ = states_to_clear;
  bVar3 = ON_ComponentStatus::IsClear((ON_ComponentStatus *)((long)&this_local + 2));
  if (bVar3) {
    this_local._4_4_ = 0;
  }
  else {
    uVar1 = ON_AggregateComponentStatus::NotCurrent.m_current;
    uVar2 = ON_AggregateComponentStatus::NotCurrent.m_reserved1;
    uVar4 = ON_AggregateComponentStatus::NotCurrent.m_component_count;
    (this->m_aggregate_status).m_aggregate_status =
         ON_AggregateComponentStatus::NotCurrent.m_aggregate_status;
    (this->m_aggregate_status).m_current = uVar1;
    (this->m_aggregate_status).m_reserved1 = uVar2;
    (this->m_aggregate_status).m_component_count = uVar4;
    uVar4 = ON_AggregateComponentStatus::NotCurrent.m_selected_persistent_count;
    (this->m_aggregate_status).m_selected_count =
         ON_AggregateComponentStatus::NotCurrent.m_selected_count;
    (this->m_aggregate_status).m_selected_persistent_count = uVar4;
    uVar4 = ON_AggregateComponentStatus::NotCurrent.m_hidden_count;
    (this->m_aggregate_status).m_highlighted_count =
         ON_AggregateComponentStatus::NotCurrent.m_highlighted_count;
    (this->m_aggregate_status).m_hidden_count = uVar4;
    uVar4 = ON_AggregateComponentStatus::NotCurrent.m_damaged_count;
    (this->m_aggregate_status).m_locked_count =
         ON_AggregateComponentStatus::NotCurrent.m_locked_count;
    (this->m_aggregate_status).m_damaged_count = uVar4;
    vit.m_current._4_4_ = 0;
    first = ON_ClassArray<ON_BrepVertex>::Array((ON_ClassArray<ON_BrepVertex> *)&this->m_V);
    uVar4 = ON_ClassArray<ON_BrepVertex>::UnsignedCount((ON_ClassArray<ON_BrepVertex> *)&this->m_V);
    ON_ArrayIterator<const_ON_BrepVertex>::ON_ArrayIterator
              ((ON_ArrayIterator<const_ON_BrepVertex> *)&p,first,(ulong)uVar4);
    local_40 = ON_ArrayIterator<const_ON_BrepVertex>::First
                         ((ON_ArrayIterator<const_ON_BrepVertex> *)&p);
    while (local_40 != (ON_BrepVertex *)0x0) {
      eit.m_current._6_2_ = this_local._2_2_;
      uVar4 = ON_ComponentStatus::ClearStates(&local_40->m_status,this_local._2_2_);
      vit.m_current._4_4_ = uVar4 + vit.m_current._4_4_;
      local_40 = ON_ArrayIterator<const_ON_BrepVertex>::Next
                           ((ON_ArrayIterator<const_ON_BrepVertex> *)&p);
    }
    first_00 = ON_ClassArray<ON_BrepEdge>::Array((ON_ClassArray<ON_BrepEdge> *)&this->m_E);
    uVar4 = ON_ClassArray<ON_BrepEdge>::UnsignedCount((ON_ClassArray<ON_BrepEdge> *)&this->m_E);
    ON_ArrayIterator<const_ON_BrepEdge>::ON_ArrayIterator
              ((ON_ArrayIterator<const_ON_BrepEdge> *)&p_1,first_00,(ulong)uVar4);
    local_68 = ON_ArrayIterator<const_ON_BrepEdge>::First
                         ((ON_ArrayIterator<const_ON_BrepEdge> *)&p_1);
    while (local_68 != (ON_BrepEdge *)0x0) {
      tit.m_current._6_2_ = this_local._2_2_;
      uVar4 = ON_ComponentStatus::ClearStates(&local_68->m_status,this_local._2_2_);
      vit.m_current._4_4_ = uVar4 + vit.m_current._4_4_;
      local_68 = ON_ArrayIterator<const_ON_BrepEdge>::Next
                           ((ON_ArrayIterator<const_ON_BrepEdge> *)&p_1);
    }
    first_01 = ON_ClassArray<ON_BrepTrim>::Array((ON_ClassArray<ON_BrepTrim> *)&this->m_T);
    uVar4 = ON_ClassArray<ON_BrepTrim>::UnsignedCount((ON_ClassArray<ON_BrepTrim> *)&this->m_T);
    ON_ArrayIterator<const_ON_BrepTrim>::ON_ArrayIterator
              ((ON_ArrayIterator<const_ON_BrepTrim> *)&p_2,first_01,(ulong)uVar4);
    local_90 = ON_ArrayIterator<const_ON_BrepTrim>::First
                         ((ON_ArrayIterator<const_ON_BrepTrim> *)&p_2);
    while (local_90 != (ON_BrepTrim *)0x0) {
      lit.m_current._6_2_ = this_local._2_2_;
      uVar4 = ON_ComponentStatus::ClearStates(&local_90->m_status,this_local._2_2_);
      vit.m_current._4_4_ = uVar4 + vit.m_current._4_4_;
      local_90 = ON_ArrayIterator<const_ON_BrepTrim>::Next
                           ((ON_ArrayIterator<const_ON_BrepTrim> *)&p_2);
    }
    first_02 = ON_ClassArray<ON_BrepLoop>::Array((ON_ClassArray<ON_BrepLoop> *)&this->m_L);
    uVar4 = ON_ClassArray<ON_BrepLoop>::UnsignedCount((ON_ClassArray<ON_BrepLoop> *)&this->m_L);
    ON_ArrayIterator<const_ON_BrepLoop>::ON_ArrayIterator
              ((ON_ArrayIterator<const_ON_BrepLoop> *)&p_3,first_02,(ulong)uVar4);
    local_b8 = ON_ArrayIterator<const_ON_BrepLoop>::First
                         ((ON_ArrayIterator<const_ON_BrepLoop> *)&p_3);
    while (local_b8 != (ON_BrepLoop *)0x0) {
      fit.m_current._6_2_ = this_local._2_2_;
      uVar4 = ON_ComponentStatus::ClearStates(&local_b8->m_status,this_local._2_2_);
      vit.m_current._4_4_ = uVar4 + vit.m_current._4_4_;
      local_b8 = ON_ArrayIterator<const_ON_BrepLoop>::Next
                           ((ON_ArrayIterator<const_ON_BrepLoop> *)&p_3);
    }
    first_03 = ON_ClassArray<ON_BrepFace>::Array((ON_ClassArray<ON_BrepFace> *)&this->m_F);
    uVar4 = ON_ClassArray<ON_BrepFace>::UnsignedCount((ON_ClassArray<ON_BrepFace> *)&this->m_F);
    ON_ArrayIterator<const_ON_BrepFace>::ON_ArrayIterator
              ((ON_ArrayIterator<const_ON_BrepFace> *)&p_4,first_03,(ulong)uVar4);
    local_e0 = ON_ArrayIterator<const_ON_BrepFace>::First
                         ((ON_ArrayIterator<const_ON_BrepFace> *)&p_4);
    while (local_e0 != (ON_BrepFace *)0x0) {
      uVar4 = ON_ComponentStatus::ClearStates(&local_e0->m_status,this_local._2_2_);
      vit.m_current._4_4_ = uVar4 + vit.m_current._4_4_;
      local_e0 = ON_ArrayIterator<const_ON_BrepFace>::Next
                           ((ON_ArrayIterator<const_ON_BrepFace> *)&p_4);
    }
    this_local._4_4_ = vit.m_current._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

unsigned int ON_Brep::ClearComponentStates(
  ON_ComponentStatus states_to_clear
  ) const
{
  if (states_to_clear.IsClear())
    return 0U;

  m_aggregate_status = ON_AggregateComponentStatus::NotCurrent;

  unsigned int rc = 0;

  ON_ArrayIterator< const ON_BrepVertex > vit( m_V.Array(), m_V.UnsignedCount() );
  for ( const ON_BrepVertex* p = vit.First(); nullptr != p; p = vit.Next())
  {
    rc += p->m_status.ClearStates(states_to_clear);
  }

  ON_ArrayIterator< const ON_BrepEdge > eit( m_E.Array(), m_E.UnsignedCount() );
  for ( const ON_BrepEdge* p = eit.First(); nullptr != p; p = eit.Next())
  {
    rc += p->m_status.ClearStates(states_to_clear);
  }

  ON_ArrayIterator< const ON_BrepTrim > tit( m_T.Array(), m_T.UnsignedCount() );
  for ( const ON_BrepTrim* p = tit.First(); nullptr != p; p = tit.Next())
  {
    rc += p->m_status.ClearStates(states_to_clear);
  }

  ON_ArrayIterator< const ON_BrepLoop > lit( m_L.Array(), m_L.UnsignedCount() );
  for ( const ON_BrepLoop* p = lit.First(); nullptr != p; p = lit.Next())
  {
    rc += p->m_status.ClearStates(states_to_clear);
  }

  ON_ArrayIterator< const ON_BrepFace > fit( m_F.Array(), m_F.UnsignedCount() );
  for ( const ON_BrepFace* p = fit.First(); nullptr != p; p = fit.Next())
  {
    rc += p->m_status.ClearStates(states_to_clear);
  }

  return rc;
}